

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O3

int surv0_pipe_init(void *arg,nni_pipe *pipe,void *s)

{
  int iVar1;
  
  iVar1 = nni_atomic_get((nni_atomic_int *)((long)s + 0x128));
  nni_aio_init((nni_aio *)((long)arg + 0x68),surv0_pipe_send_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x230),surv0_pipe_recv_cb,arg);
  nni_lmq_init((nni_lmq *)((long)arg + 0x10),(long)iVar1);
  *(nni_pipe **)arg = pipe;
  *(void **)((long)arg + 8) = s;
  return 0;
}

Assistant:

static int
surv0_pipe_init(void *arg, nni_pipe *pipe, void *s)
{
	surv0_pipe *p    = arg;
	surv0_sock *sock = s;
	int         len;

	len = nni_atomic_get(&sock->send_buf);
	nni_aio_init(&p->aio_send, surv0_pipe_send_cb, p);
	nni_aio_init(&p->aio_recv, surv0_pipe_recv_cb, p);

	// This depth could be tunable.  The deeper the queue, the more
	// concurrent surveys that can be delivered (multiple contexts).
	// Note that surveys can be *outstanding*, but not yet put on the wire.
	nni_lmq_init(&p->send_queue, len);

	p->pipe = pipe;
	p->sock = sock;
	return (0);
}